

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::_getAddressTakenFuns
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,CallInst *C)

{
  pointer ppFVar1;
  bool bVar2;
  CallCompatibility policy;
  CallCompatibility extraout_EDX;
  CallCompatibility extraout_EDX_00;
  CallCompatibility extraout_EDX_01;
  pointer ppFVar3;
  Function *fun;
  Function *local_30;
  
  policy = (CallCompatibility)C;
  if (this->_address_taken_initialized == false) {
    _initializeAddressTaken(this);
    policy = extraout_EDX;
  }
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar1 = (this->_address_taken).
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar3 = (this->_address_taken).
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1;
      ppFVar3 = ppFVar3 + 1) {
    local_30 = *ppFVar3;
    bVar2 = anon_unknown_2::callIsCompatible(local_30,C,policy);
    policy = extraout_EDX_00;
    if (bVar2) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                (__return_storage_ptr__,&local_30);
      policy = extraout_EDX_01;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec _getAddressTakenFuns(const llvm::CallInst *C) {
        // FIXME: check that C calls initialized values
        // (in many non-executable pieces of code, the call may call
        // an uninitialized function pointer. Return no function
        // in such cases instead of all address taken functions.
        if (!_address_taken_initialized)
            _initializeAddressTaken();
        assert(_address_taken_initialized);

        FuncVec ret;
        // filter out compatible functions
        for (auto *fun : _address_taken) {
            if (callIsCompatible(fun, C)) {
                ret.push_back(fun);
            }
        }
        return ret;
    }